

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void merge_cache_lcp_2way<false,unsigned_char>
               (uchar **from0,lcp_t *lcp_input0,uchar *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uchar *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uchar *cache_result)

{
  uchar **ppuVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  byte *pbVar5;
  tuple<int&,unsigned_long&> local_f8 [16];
  tuple<int,_unsigned_long> local_e8;
  size_t local_d8;
  lcp_t lcp01_1;
  string local_c8 [4];
  int cmp01_1;
  string local_98 [32];
  tuple<int&,unsigned_long&> local_78 [16];
  tuple<int,_unsigned_long> local_68;
  size_t local_58;
  lcp_t lcp01;
  int cmp01;
  uchar cache1;
  uchar cache0;
  lcp_t lcp1;
  lcp_t lcp0;
  lcp_t *lcp_input1_local;
  uchar **from1_local;
  size_t n0_local;
  uchar *cache_input0_local;
  lcp_t *lcp_input0_local;
  uchar **from0_local;
  
  lcp0 = (lcp_t)lcp_input1;
  lcp_input1_local = (lcp_t *)from1;
  from1_local = (uchar **)n0;
  n0_local = (size_t)cache_input0;
  cache_input0_local = (uchar *)lcp_input0;
  lcp_input0_local = (lcp_t *)from0;
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"merge_cache_lcp_2way");
  poVar4 = std::operator<<(poVar4,"(): n0=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)from1_local);
  poVar4 = std::operator<<(poVar4,", n1=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,n1);
  std::operator<<(poVar4,'\n');
  check_input<unsigned_char>
            ((uchar **)lcp_input0_local,(lcp_t *)cache_input0_local,(uchar *)n0_local,
             (size_t)from1_local);
  check_input<unsigned_char>((uchar **)lcp_input1_local,(lcp_t *)lcp0,cache_input1,n1);
  lcp1 = 0;
  _cmp01 = 0;
  lcp01._7_1_ = *(byte *)n0_local;
  pbVar5 = cache_input1 + 1;
  lcp01._6_1_ = *cache_input1;
  n0_local = n0_local + 1;
  stat_try_cache();
  if (lcp01._7_1_ < lcp01._6_1_) {
    iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
    if (-1 < iVar3) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
    *result = (uchar *)*lcp_input0_local;
    lcp1 = *(lcp_t *)cache_input0_local;
    lcp01._7_1_ = *(byte *)n0_local;
    lcp_input0_local = lcp_input0_local + 1;
    cache_input0_local = cache_input0_local + 8;
    n0_local = n0_local + 1;
  }
  else {
    if (lcp01._6_1_ < lcp01._7_1_) {
      iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
      if (iVar3 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x45c,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                     );
      }
      *result = (uchar *)*lcp_input1_local;
      _cmp01 = *(size_t *)lcp0;
      lcp01._6_1_ = *pbVar5;
      lcp_input1_local = lcp_input1_local + 1;
      lcp0 = lcp0 + 8;
joined_r0x003091bd:
      n1 = n1 - 1;
      cache_input1 = cache_input1 + 2;
      ppuVar1 = result + 1;
      if (n1 == 0) {
LAB_00309e07:
        result = ppuVar1;
        if (from1_local != (uchar **)0x0) {
          std::copy<unsigned_char**,unsigned_char**>
                    ((uchar **)lcp_input0_local,(uchar **)(lcp_input0_local + (long)from1_local),
                     result);
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
          poVar4 = std::operator<<(poVar4,'~');
          poVar4 = std::operator<<(poVar4,"merge_cache_lcp_2way");
          std::operator<<(poVar4,'\n');
          return;
        }
        __assert_fail("n0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x527,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                     );
      }
      goto LAB_00309456;
    }
    bVar2 = is_end<unsigned_char>(lcp01._7_1_);
    if (bVar2) {
      iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
      if (iVar3 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                     );
      }
      *result = (uchar *)*lcp_input0_local;
      lcp1 = *(lcp_t *)cache_input0_local;
      lcp01._7_1_ = *(byte *)n0_local;
    }
    else {
      stat_cache_useless();
      compare((uchar *)&local_68,(uchar *)*lcp_input0_local,*lcp_input1_local);
      std::tie<int,unsigned_long>((int *)local_78,&lcp01);
      std::tuple<int&,unsigned_long&>::operator=(local_78,&local_68);
      if ((int)lcp01 < 0) {
        *result = (uchar *)*lcp_input0_local;
        lcp1 = *(lcp_t *)cache_input0_local;
        _cmp01 = local_58;
        lcp01._7_1_ = *(byte *)n0_local;
        n0_local = n0_local + 1;
        cache_input0_local = cache_input0_local + 8;
        lcp_input0_local = lcp_input0_local + 1;
        lcp01._6_1_ = get_char<unsigned_char>((uchar *)*lcp_input1_local,local_58);
        goto joined_r0x00309276;
      }
      if ((int)lcp01 != 0) {
        *result = (uchar *)*lcp_input1_local;
        lcp1 = local_58;
        _cmp01 = *(size_t *)lcp0;
        lcp0 = lcp0 + 8;
        lcp_input1_local = lcp_input1_local + 1;
        lcp01._7_1_ = get_char<unsigned_char>((uchar *)*lcp_input0_local,local_58);
        lcp01._6_1_ = *pbVar5;
        goto joined_r0x003091bd;
      }
      *result = (uchar *)*lcp_input0_local;
      lcp1 = *(lcp_t *)cache_input0_local;
      lcp01._7_1_ = *(byte *)n0_local;
      _cmp01 = local_58;
    }
    lcp01._6_1_ = 0;
    lcp_input0_local = lcp_input0_local + 1;
    cache_input0_local = cache_input0_local + 8;
    n0_local = n0_local + 1;
  }
joined_r0x00309276:
  from1_local = (uchar **)((long)from1_local + -1);
  cache_input1 = pbVar5;
  ppuVar1 = result + 1;
  if (from1_local == (uchar **)0x0) {
LAB_00309d5a:
    result = ppuVar1;
    from1_local = (uchar **)0x0;
    if (n1 != 0) {
      std::copy<unsigned_char**,unsigned_char**>
                ((uchar **)lcp_input1_local,(uchar **)(lcp_input1_local + n1),result);
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,'~');
      poVar4 = std::operator<<(poVar4,"merge_cache_lcp_2way");
      std::operator<<(poVar4,'\n');
      return;
    }
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x51e,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                 );
  }
LAB_00309456:
  result = result + 1;
  do {
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"Starting loop, n0=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)from1_local);
    poVar4 = std::operator<<(poVar4,", n1=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,n1);
    poVar4 = std::operator<<(poVar4," ...\n");
    poVar4 = std::operator<<(poVar4,"\tprev   = \'");
    poVar4 = std::operator<<(poVar4,result[-1]);
    poVar4 = std::operator<<(poVar4,"\'\n");
    poVar4 = std::operator<<(poVar4,"\t*from0 = \'");
    poVar4 = std::operator<<(poVar4,(uchar *)*lcp_input0_local);
    poVar4 = std::operator<<(poVar4,"\'\n");
    poVar4 = std::operator<<(poVar4,"\t*from1 = \'");
    poVar4 = std::operator<<(poVar4,(uchar *)*lcp_input1_local);
    poVar4 = std::operator<<(poVar4,"\'\n");
    poVar4 = std::operator<<(poVar4,"\tlcp0   = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lcp1);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"\tlcp1   = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,_cmp01);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"\tcache0 = \'");
    to_str_abi_cxx11_((uchar)local_98);
    poVar4 = std::operator<<(poVar4,local_98);
    poVar4 = std::operator<<(poVar4,"\'\n");
    poVar4 = std::operator<<(poVar4,"\tcache1 = \'");
    to_str_abi_cxx11_((uchar)local_c8);
    poVar4 = std::operator<<(poVar4,local_c8);
    poVar4 = std::operator<<(poVar4,"\'\n");
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_98);
    check_lcp_and_cache<unsigned_char>
              (result[-1],(uchar *)*lcp_input0_local,lcp1,lcp01._7_1_,(uchar *)*lcp_input1_local,
               _cmp01,lcp01._6_1_);
    if (_cmp01 < lcp1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      std::operator<<(poVar4,"\tlcp0 > lcp1\n");
      iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
      if (-1 < iVar3) {
        __assert_fail("cmp(*from0, *from1) < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4ae,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                     );
      }
      *result = (uchar *)*lcp_input0_local;
      lcp1 = *(lcp_t *)cache_input0_local;
      lcp01._7_1_ = *(byte *)n0_local;
      lcp_input0_local = lcp_input0_local + 1;
      cache_input0_local = cache_input0_local + 8;
      n0_local = n0_local + 1;
joined_r0x00309b47:
      from1_local = (uchar **)((long)from1_local + -1);
      ppuVar1 = result + 1;
      if (from1_local == (uchar **)0x0) goto LAB_00309d5a;
    }
    else {
      if (_cmp01 <= lcp1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar4,"\tlcp0 == lcp1\n");
        stat_try_cache();
        if (lcp01._7_1_ < lcp01._6_1_) {
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
          std::operator<<(poVar4,"\t\tcache0 < cache1\n");
          iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
          if (-1 < iVar3) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4c6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                         );
          }
          *result = (uchar *)*lcp_input0_local;
          lcp1 = *(lcp_t *)cache_input0_local;
          lcp01._7_1_ = *(byte *)n0_local;
          lcp_input0_local = lcp_input0_local + 1;
          cache_input0_local = cache_input0_local + 8;
          n0_local = n0_local + 1;
        }
        else {
          if (lcp01._6_1_ < lcp01._7_1_) {
            poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
            std::operator<<(poVar4,"\t\tcache0 > cache1\n");
            iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
            if (iVar3 < 1) {
              __assert_fail("cmp(*from0, *from1) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4d6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                           );
            }
            *result = (uchar *)*lcp_input1_local;
            _cmp01 = *(size_t *)lcp0;
            lcp01._6_1_ = *cache_input1;
            lcp0 = lcp0 + 8;
            lcp_input1_local = lcp_input1_local + 1;
            goto joined_r0x00309d40;
          }
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
          std::operator<<(poVar4,"\t\tcache0 == cache1\n");
          bVar2 = is_end<unsigned_char>(lcp01._7_1_);
          if (bVar2) {
            iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
            if (iVar3 != 0) {
              __assert_fail("cmp(*from0, *from1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4e7,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                           );
            }
            *result = (uchar *)*lcp_input0_local;
            lcp1 = *(lcp_t *)cache_input0_local;
            lcp01._7_1_ = *(byte *)n0_local;
          }
          else {
            stat_cache_useless();
            compare((uchar *)&local_e8,(uchar *)*lcp_input0_local,*lcp_input1_local);
            std::tie<int,unsigned_long>((int *)local_f8,(unsigned_long *)((long)&lcp01_1 + 4));
            std::tuple<int&,unsigned_long&>::operator=(local_f8,&local_e8);
            if (lcp01_1._4_4_ < 0) {
              *result = (uchar *)*lcp_input0_local;
              lcp1 = *(lcp_t *)cache_input0_local;
              _cmp01 = local_d8;
              lcp01._7_1_ = *(byte *)n0_local;
              n0_local = n0_local + 1;
              cache_input0_local = cache_input0_local + 8;
              lcp_input0_local = lcp_input0_local + 1;
              lcp01._6_1_ = get_char<unsigned_char>((uchar *)*lcp_input1_local,local_d8);
              goto joined_r0x00309b47;
            }
            if (lcp01_1._4_4_ != 0) {
              *result = (uchar *)*lcp_input1_local;
              lcp1 = local_d8;
              _cmp01 = *(size_t *)lcp0;
              lcp0 = lcp0 + 8;
              lcp_input1_local = lcp_input1_local + 1;
              lcp01._7_1_ = get_char<unsigned_char>((uchar *)*lcp_input0_local,local_d8);
              lcp01._6_1_ = *cache_input1;
              goto joined_r0x00309d40;
            }
            *result = (uchar *)*lcp_input0_local;
            lcp1 = *(lcp_t *)cache_input0_local;
            lcp01._7_1_ = *(byte *)n0_local;
            lcp01._6_1_ = 0;
            _cmp01 = local_d8;
          }
          lcp_input0_local = lcp_input0_local + 1;
          cache_input0_local = cache_input0_local + 8;
          n0_local = n0_local + 1;
        }
        goto joined_r0x00309b47;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      std::operator<<(poVar4,"\tlcp0 < lcp1\n");
      iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
      if (iVar3 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                     );
      }
      *result = (uchar *)*lcp_input1_local;
      _cmp01 = *(size_t *)lcp0;
      lcp01._6_1_ = *cache_input1;
      lcp0 = lcp0 + 8;
      lcp_input1_local = lcp_input1_local + 1;
joined_r0x00309d40:
      n1 = n1 - 1;
      cache_input1 = cache_input1 + 1;
      ppuVar1 = result + 1;
      if (n1 == 0) goto LAB_00309e07;
    }
    result = result + 1;
  } while( true );
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}